

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  BYTE *d;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  long *plVar8;
  ulong uVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  char *pcVar14;
  int iVar15;
  long lVar16;
  char cVar17;
  BYTE *pBVar18;
  long *plVar19;
  long *plVar20;
  int *piVar21;
  long *plVar22;
  ulong uVar23;
  BYTE *pBVar24;
  BYTE *pBVar25;
  BYTE *s;
  long lVar26;
  long lVar27;
  int *piVar28;
  BYTE *e_2;
  BYTE *pBVar29;
  ulong uVar30;
  size_t __n;
  U32 *hashTable;
  BYTE *e;
  char *local_a0;
  U32 *hashTable_21;
  
  if (*(int *)((long)LZ4_stream->table + 0x4004) != 0) {
    return 0;
  }
  uVar3 = (uint)LZ4_stream->table[0x803];
  pBVar18 = (BYTE *)((ulong)uVar3 + LZ4_stream->table[0x801]);
  pBVar24 = (BYTE *)source;
  if (pBVar18 < source) {
    pBVar24 = pBVar18;
  }
  if (uVar3 == 0) {
    pBVar24 = (BYTE *)source;
  }
  LZ4_renormDictT((LZ4_stream_t_internal *)LZ4_stream,pBVar24);
  if (acceleration < 2) {
    acceleration = 1;
  }
  pBVar29 = (BYTE *)(source + inputSize);
  pBVar24 = (BYTE *)LZ4_stream->table[0x801];
  if (pBVar29 < pBVar18 && pBVar24 < pBVar29) {
    uVar2 = (int)pBVar18 - (int)pBVar29;
    uVar3 = 0x10000;
    if (uVar2 < 0x10000) {
      uVar3 = uVar2;
    }
    uVar7 = 0;
    if (3 < uVar2) {
      uVar7 = (ulong)uVar3;
    }
    *(int *)(LZ4_stream->table + 0x803) = (int)uVar7;
    pBVar24 = pBVar18 + -uVar7;
    LZ4_stream->table[0x801] = (longlong)pBVar24;
  }
  uVar3 = (uint)LZ4_stream->table[0x803];
  uVar7 = (ulong)uVar3;
  iVar4 = (int)dest;
  if (pBVar18 != (BYTE *)source) {
    plVar19 = (long *)source;
    if (uVar3 < 0x10000) {
      uVar2 = (uint)LZ4_stream->table[0x800];
      uVar9 = (ulong)uVar2;
      if (uVar2 <= uVar3) goto LAB_001688fb;
      if (0x7e000000 < (uint)inputSize) goto LAB_00168903;
      local_a0 = dest;
      if (0xc < (uint)inputSize) {
        plVar8 = (long *)(pBVar29 + -5);
        lVar27 = (long)source - uVar9;
        *(uint *)((long)LZ4_stream->table +
                 (ulong)((uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4) =
             uVar2;
        plVar20 = (long *)source;
LAB_001685bb:
        uVar6 = 1;
        lVar26 = *(long *)((long)plVar20 + 1);
        plVar5 = (long *)((long)plVar20 + 1);
        uVar3 = acceleration << 6;
        do {
          plVar22 = (long *)(uVar6 + (long)plVar5);
          plVar19 = plVar20;
          if (pBVar29 + -0xc < plVar22) break;
          uVar23 = (ulong)((uint)((ulong)(lVar26 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
          uVar6 = (ulong)*(uint *)((long)LZ4_stream->table + uVar23 * 4);
          pcVar13 = (char *)(lVar27 + uVar6);
          lVar26 = *plVar22;
          iVar15 = (int)plVar5;
          iVar11 = (int)lVar27;
          *(int *)((long)LZ4_stream->table + uVar23 * 4) = iVar15 - iVar11;
          if ((source + -uVar7 <= pcVar13) && (plVar5 <= (long *)(lVar27 + uVar6 + 0xffff))) {
            pBVar18 = (BYTE *)0x0;
            if (pcVar13 < source) {
              pBVar18 = pBVar24 + (uVar7 - (long)source);
            }
            if (*(int *)(pcVar13 + (long)pBVar18) == (int)*plVar5) goto LAB_0016863f;
          }
          uVar6 = (ulong)(uVar3 >> 6);
          uVar3 = uVar3 + 1;
          plVar5 = plVar22;
        } while( true );
      }
LAB_001690c2:
      __n = (long)pBVar29 - (long)plVar19;
      iVar15 = 0;
      if (local_a0 + (__n + 0xf0) / 0xff + (__n - (long)dest) + 1 <=
          (char *)(ulong)(uint)maxOutputSize) {
        pcVar13 = local_a0;
        if (__n < 0xf) goto LAB_00169114;
        *local_a0 = -0x10;
        for (uVar7 = __n - 0xf; local_a0 = local_a0 + 1, 0xfe < uVar7; uVar7 = uVar7 - 0xff) {
          *local_a0 = -1;
        }
LAB_0016911e:
        *local_a0 = (char)uVar7;
        pcVar13 = local_a0;
        goto LAB_00169120;
      }
    }
    else {
LAB_001688fb:
      if ((uint)inputSize < 0x7e000001) {
        pcVar13 = dest;
        if (0xc < (uint)inputSize) {
          plVar8 = (long *)(pBVar29 + -5);
          uVar3 = (uint)LZ4_stream->table[0x800];
          uVar9 = (ulong)uVar3;
          lVar27 = (long)source - uVar9;
          *(uint *)((long)LZ4_stream->table +
                   (ulong)((uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4) =
               uVar3;
          plVar20 = (long *)source;
          local_a0 = dest;
LAB_001689e5:
          lVar26 = *(long *)((long)plVar20 + 1);
          uVar6 = 1;
          plVar5 = (long *)((long)plVar20 + 1);
          uVar3 = acceleration << 6;
          do {
            plVar22 = (long *)(uVar6 + (long)plVar5);
            plVar19 = plVar20;
            pcVar13 = local_a0;
            if (pBVar29 + -0xc < plVar22) break;
            uVar23 = (ulong)((uint)((ulong)(lVar26 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
            uVar6 = (ulong)*(uint *)((long)LZ4_stream->table + uVar23 * 4);
            lVar26 = *plVar22;
            iVar15 = (int)plVar5;
            iVar11 = (int)lVar27;
            *(int *)((long)LZ4_stream->table + uVar23 * 4) = iVar15 - iVar11;
            if (plVar5 <= (long *)(uVar6 + lVar27 + 0xffff)) {
              pcVar13 = (char *)(uVar6 + lVar27);
              pBVar18 = (BYTE *)0x0;
              if (pcVar13 < source) {
                pBVar18 = pBVar24 + (uVar7 - (long)source);
              }
              if (*(int *)(pcVar13 + (long)pBVar18) == (int)*plVar5) goto LAB_00168a59;
            }
            uVar6 = (ulong)(uVar3 >> 6);
            uVar3 = uVar3 + 1;
            plVar5 = plVar22;
          } while( true );
        }
LAB_00168d2c:
        __n = (long)pBVar29 - (long)plVar19;
        iVar15 = 0;
        if (pcVar13 + (__n + 0xf0) / 0xff + (__n - (long)dest) + 1 <=
            (char *)(ulong)(uint)maxOutputSize) {
          if (0xe < __n) {
            *pcVar13 = -0x10;
            local_a0 = pcVar13;
            for (uVar7 = __n - 0xf; local_a0 = local_a0 + 1, 0xfe < uVar7; uVar7 = uVar7 - 0xff) {
              *local_a0 = -1;
            }
            goto LAB_0016911e;
          }
LAB_00169114:
          *pcVar13 = (char)__n << 4;
LAB_00169120:
          memcpy(pcVar13 + 1,plVar19,__n);
          iVar15 = ((int)(pcVar13 + 1) + (int)__n) - iVar4;
        }
      }
      else {
LAB_00168903:
        iVar15 = 0;
      }
    }
LAB_00169137:
    LZ4_stream->table[0x801] = (longlong)source;
    iVar4 = inputSize;
    goto LAB_001694e5;
  }
  if (uVar3 < 0x10000) {
    uVar2 = (uint)LZ4_stream->table[0x800];
    if (uVar2 <= uVar3) goto LAB_0016893a;
    if ((uint)inputSize < 0x7e000001) {
      plVar19 = (long *)source;
      pcVar13 = dest;
      if (0xc < (uint)inputSize) {
        piVar28 = (int *)(source + -uVar7);
        lVar27 = (long)source - (ulong)uVar2;
        *(uint *)((long)LZ4_stream->table +
                 (ulong)((uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4) =
             uVar2;
        do {
          uVar7 = 1;
          lVar26 = *(long *)((long)plVar19 + 1);
          plVar8 = (long *)((long)plVar19 + 1);
          uVar3 = acceleration << 6;
          while( true ) {
            plVar20 = (long *)(uVar7 + (long)plVar8);
            if (pBVar29 + -0xc < plVar20) goto LAB_00169443;
            uVar9 = (ulong)((uint)((ulong)(lVar26 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
            uVar7 = (ulong)*(uint *)((long)LZ4_stream->table + uVar9 * 4);
            lVar26 = *plVar20;
            iVar11 = (int)plVar8;
            iVar15 = (int)lVar27;
            *(int *)((long)LZ4_stream->table + uVar9 * 4) = iVar11 - iVar15;
            if (((piVar28 <= (int *)(lVar27 + uVar7)) &&
                (plVar8 <= (long *)(lVar27 + uVar7 + 0xffff))) &&
               (*(int *)(lVar27 + uVar7) == (int)*plVar8)) break;
            uVar7 = (ulong)(uVar3 >> 6);
            uVar3 = uVar3 + 1;
            plVar8 = plVar20;
          }
          lVar26 = uVar7 - uVar2;
          lVar1 = 0;
          cVar17 = (char)plVar8 * '\x10' + (char)plVar19 * -0x10;
          do {
            cVar10 = cVar17;
            lVar16 = lVar1;
            piVar21 = (int *)(source + lVar16 + lVar26);
            plVar20 = (long *)((long)plVar8 + lVar16);
            if ((plVar20 <= plVar19) || (piVar21 <= piVar28)) break;
            lVar1 = lVar16 + -1;
            cVar17 = cVar10 + -0x10;
          } while (*(char *)((long)plVar8 + lVar16 + -1) == source[lVar16 + lVar26 + -1]);
          uVar3 = iVar11 - (int)plVar19;
          uVar9 = (ulong)(uVar3 + (int)lVar16);
          uVar7 = (ulong)uVar3 + lVar16;
          if (dest + maxOutputSize < pcVar13 + (uVar7 & 0xffffffff) / 0xff + uVar9 + 9)
          goto LAB_0016953c;
          if ((uint)uVar7 < 0xf) {
            plVar8 = (long *)(pcVar13 + 1);
            *pcVar13 = cVar10;
          }
          else {
            *pcVar13 = -0x10;
            plVar8 = (long *)(pcVar13 + 2);
            for (iVar11 = (iVar11 - (int)plVar19) + (int)lVar16 + -0xf; 0xfe < iVar11;
                iVar11 = iVar11 + -0xff) {
              *(char *)((long)plVar8 + -1) = -1;
              plVar8 = (long *)((long)plVar8 + 1);
            }
            *(char *)((long)plVar8 + -1) = (char)iVar11;
          }
          plVar5 = (long *)(uVar9 + (long)plVar8);
          do {
            *plVar8 = *plVar19;
            plVar8 = plVar8 + 1;
            plVar19 = plVar19 + 1;
          } while (plVar8 < plVar5);
          while( true ) {
            *(short *)plVar5 = (short)plVar20 - (short)piVar21;
            uVar3 = LZ4_count((BYTE *)((long)plVar20 + 4),(BYTE *)(piVar21 + 1),pBVar29 + -5);
            if (dest + maxOutputSize < (char *)((long)plVar5 + (ulong)(uVar3 >> 8) + 8))
            goto LAB_0016953c;
            pcVar14 = (char *)((long)plVar5 + 2);
            if (uVar3 < 0xf) {
              *pcVar13 = *pcVar13 + (char)uVar3;
              pcVar13 = pcVar14;
            }
            else {
              *pcVar13 = *pcVar13 + '\x0f';
              for (uVar12 = uVar3 - 0xf; 0x1fd < uVar12; uVar12 = uVar12 - 0x1fe) {
                pcVar14[0] = -1;
                pcVar14[1] = -1;
                pcVar14 = pcVar14 + 2;
              }
              if (0xfe < uVar12) {
                uVar12 = uVar12 - 0xff;
                *pcVar14 = -1;
                pcVar14 = pcVar14 + 1;
              }
              *pcVar14 = (char)uVar12;
              pcVar13 = pcVar14 + 1;
            }
            plVar19 = (long *)((long)plVar20 + (ulong)(uVar3 + 4));
            if (pBVar29 + -0xc < plVar19) goto LAB_00169443;
            *(int *)((long)LZ4_stream->table +
                    (ulong)((uint)((ulong)(*(long *)((long)plVar19 + -2) * 0xcf1bbcdcbb) >> 0x1c) &
                           0xfff) * 4) = ((int)plVar19 + -2) - iVar15;
            uVar7 = (ulong)((uint)((ulong)(*plVar19 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
            uVar9 = (ulong)*(uint *)((long)LZ4_stream->table + uVar7 * 4);
            piVar21 = (int *)(lVar27 + uVar9);
            *(int *)((long)LZ4_stream->table + uVar7 * 4) = (int)plVar19 - iVar15;
            if (((piVar21 < piVar28) || ((long *)(lVar27 + uVar9 + 0xffff) < plVar19)) ||
               (*piVar21 != (int)*plVar19)) break;
            plVar5 = (long *)(pcVar13 + 1);
            *pcVar13 = '\0';
            plVar20 = plVar19;
          }
        } while( true );
      }
LAB_00169443:
      uVar7 = (long)pBVar29 - (long)plVar19;
      iVar15 = 0;
      if (pcVar13 + (uVar7 + 0xf0) / 0xff + (uVar7 - (long)dest) + 1 <=
          (char *)(ulong)(uint)maxOutputSize) {
        if (uVar7 < 0xf) {
          *pcVar13 = (char)uVar7 << 4;
        }
        else {
          *pcVar13 = -0x10;
          for (uVar9 = uVar7 - 0xf; pcVar13 = pcVar13 + 1, 0xfe < uVar9; uVar9 = uVar9 - 0xff) {
            *pcVar13 = -1;
          }
          *pcVar13 = (char)uVar9;
        }
        memcpy(pcVar13 + 1,plVar19,uVar7);
        iVar15 = ((int)(pcVar13 + 1) + (int)uVar7) - iVar4;
      }
      goto LAB_001694d7;
    }
  }
  else {
LAB_0016893a:
    if ((uint)inputSize < 0x7e000001) {
      plVar19 = (long *)source;
      pcVar13 = dest;
      if (0xc < (uint)inputSize) {
        uVar3 = (uint)LZ4_stream->table[0x800];
        lVar27 = (long)source - (ulong)uVar3;
        *(uint *)((long)LZ4_stream->table +
                 (ulong)((uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4) =
             uVar3;
        do {
          uVar9 = 1;
          lVar26 = *(long *)((long)plVar19 + 1);
          plVar8 = (long *)((long)plVar19 + 1);
          uVar2 = acceleration << 6;
          while( true ) {
            plVar20 = (long *)(uVar9 + (long)plVar8);
            if (pBVar29 + -0xc < plVar20) goto LAB_00169048;
            uVar6 = (ulong)((uint)((ulong)(lVar26 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
            uVar9 = (ulong)*(uint *)((long)LZ4_stream->table + uVar6 * 4);
            lVar26 = *plVar20;
            iVar11 = (int)plVar8;
            iVar15 = (int)lVar27;
            *(int *)((long)LZ4_stream->table + uVar6 * 4) = iVar11 - iVar15;
            if ((plVar8 <= (long *)(uVar9 + lVar27 + 0xffff)) &&
               (*(int *)(uVar9 + lVar27) == (int)*plVar8)) break;
            uVar9 = (ulong)(uVar2 >> 6);
            uVar2 = uVar2 + 1;
            plVar8 = plVar20;
          }
          lVar26 = uVar9 - uVar3;
          lVar1 = 0;
          cVar17 = (char)plVar8 * '\x10' + (char)plVar19 * -0x10;
          do {
            cVar10 = cVar17;
            lVar16 = lVar1;
            piVar28 = (int *)(source + lVar16 + lVar26);
            plVar20 = (long *)((long)plVar8 + lVar16);
            if ((plVar20 <= plVar19) || (piVar28 <= source + -uVar7)) break;
            lVar1 = lVar16 + -1;
            cVar17 = cVar10 + -0x10;
          } while (*(char *)((long)plVar8 + lVar16 + -1) == source[lVar16 + lVar26 + -1]);
          uVar2 = iVar11 - (int)plVar19;
          uVar6 = (ulong)(uVar2 + (int)lVar16);
          uVar9 = (ulong)uVar2 + lVar16;
          if (dest + maxOutputSize < pcVar13 + (uVar9 & 0xffffffff) / 0xff + uVar6 + 9)
          goto LAB_0016953c;
          if ((uint)uVar9 < 0xf) {
            plVar8 = (long *)(pcVar13 + 1);
            *pcVar13 = cVar10;
          }
          else {
            *pcVar13 = -0x10;
            plVar8 = (long *)(pcVar13 + 2);
            for (iVar11 = (iVar11 - (int)plVar19) + (int)lVar16 + -0xf; 0xfe < iVar11;
                iVar11 = iVar11 + -0xff) {
              *(char *)((long)plVar8 + -1) = -1;
              plVar8 = (long *)((long)plVar8 + 1);
            }
            *(char *)((long)plVar8 + -1) = (char)iVar11;
          }
          plVar5 = (long *)(uVar6 + (long)plVar8);
          do {
            *plVar8 = *plVar19;
            plVar8 = plVar8 + 1;
            plVar19 = plVar19 + 1;
          } while (plVar8 < plVar5);
          while( true ) {
            *(short *)plVar5 = (short)plVar20 - (short)piVar28;
            uVar2 = LZ4_count((BYTE *)((long)plVar20 + 4),(BYTE *)(piVar28 + 1),pBVar29 + -5);
            if (dest + maxOutputSize < (char *)((long)plVar5 + (ulong)(uVar2 >> 8) + 8))
            goto LAB_0016953c;
            pcVar14 = (char *)((long)plVar5 + 2);
            if (uVar2 < 0xf) {
              *pcVar13 = *pcVar13 + (char)uVar2;
              pcVar13 = pcVar14;
            }
            else {
              *pcVar13 = *pcVar13 + '\x0f';
              for (uVar12 = uVar2 - 0xf; 0x1fd < uVar12; uVar12 = uVar12 - 0x1fe) {
                pcVar14[0] = -1;
                pcVar14[1] = -1;
                pcVar14 = pcVar14 + 2;
              }
              if (0xfe < uVar12) {
                uVar12 = uVar12 - 0xff;
                *pcVar14 = -1;
                pcVar14 = pcVar14 + 1;
              }
              *pcVar14 = (char)uVar12;
              pcVar13 = pcVar14 + 1;
            }
            plVar19 = (long *)((long)plVar20 + (ulong)(uVar2 + 4));
            if (pBVar29 + -0xc < plVar19) goto LAB_00169048;
            *(int *)((long)LZ4_stream->table +
                    (ulong)((uint)((ulong)(*(long *)((long)plVar19 + -2) * 0xcf1bbcdcbb) >> 0x1c) &
                           0xfff) * 4) = ((int)plVar19 + -2) - iVar15;
            uVar9 = (ulong)((uint)((ulong)(*plVar19 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
            uVar6 = (ulong)*(uint *)((long)LZ4_stream->table + uVar9 * 4);
            piVar28 = (int *)(uVar6 + lVar27);
            *(int *)((long)LZ4_stream->table + uVar9 * 4) = (int)plVar19 - iVar15;
            if (((long *)(uVar6 + lVar27 + 0xffff) < plVar19) || (*piVar28 != (int)*plVar19)) break;
            plVar5 = (long *)(pcVar13 + 1);
            *pcVar13 = '\0';
            plVar20 = plVar19;
          }
        } while( true );
      }
LAB_00169048:
      uVar7 = (long)pBVar29 - (long)plVar19;
      iVar15 = 0;
      if (pcVar13 + (uVar7 + 0xf0) / 0xff + (uVar7 - (long)dest) + 1 <=
          (char *)(ulong)(uint)maxOutputSize) {
        if (uVar7 < 0xf) {
          *pcVar13 = (char)uVar7 << 4;
        }
        else {
          *pcVar13 = -0x10;
          for (uVar9 = uVar7 - 0xf; pcVar13 = pcVar13 + 1, 0xfe < uVar9; uVar9 = uVar9 - 0xff) {
            *pcVar13 = -1;
          }
          *pcVar13 = (char)uVar9;
        }
        memcpy(pcVar13 + 1,plVar19,uVar7);
        iVar15 = ((int)(pcVar13 + 1) + (int)uVar7) - iVar4;
      }
      goto LAB_001694d7;
    }
  }
  iVar15 = 0;
LAB_001694d7:
  iVar4 = (int)LZ4_stream->table[0x803] + inputSize;
LAB_001694e5:
  *(int *)(LZ4_stream->table + 0x803) = iVar4;
  *(int *)(LZ4_stream->table + 0x800) = (int)LZ4_stream->table[0x800] + inputSize;
  return iVar15;
LAB_0016953c:
  iVar15 = 0;
  goto LAB_001694d7;
LAB_00168a59:
  pBVar25 = (BYTE *)source;
  if (pcVar13 < source) {
    pBVar25 = pBVar24;
  }
  cVar17 = (char)plVar5 * '\x10' + (char)plVar20 * -0x10;
  for (lVar26 = 0;
      ((plVar19 = (long *)((long)plVar5 + lVar26), plVar20 < plVar19 &&
       (pBVar25 < source + (long)(pBVar18 + lVar26 + (uVar6 - uVar9)))) &&
      (*(char *)((long)plVar5 + lVar26 + -1) ==
       source[(long)(pBVar18 + lVar26 + (uVar6 - uVar9) + -1)])); lVar26 = lVar26 + -1) {
    cVar17 = cVar17 + -0x10;
  }
  uVar3 = iVar15 - (int)plVar20;
  uVar30 = (ulong)(uVar3 + (int)lVar26);
  uVar23 = (ulong)uVar3 + lVar26;
  if (dest + maxOutputSize < local_a0 + (uVar23 & 0xffffffff) / 0xff + uVar30 + 9)
  goto LAB_00168903;
  if ((uint)uVar23 < 0xf) {
    plVar5 = (long *)(local_a0 + 1);
    *local_a0 = cVar17;
  }
  else {
    *local_a0 = -0x10;
    plVar5 = (long *)(local_a0 + 2);
    for (iVar15 = (iVar15 - (int)plVar20) + (int)lVar26 + -0xf; 0xfe < iVar15;
        iVar15 = iVar15 + -0xff) {
      *(char *)((long)plVar5 + -1) = -1;
      plVar5 = (long *)((long)plVar5 + 1);
    }
    *(char *)((long)plVar5 + -1) = (char)iVar15;
  }
  pcVar14 = source + lVar26 + (uVar6 - uVar9);
  plVar22 = (long *)(uVar30 + (long)plVar5);
  do {
    *plVar5 = *plVar20;
    plVar5 = plVar5 + 1;
    plVar20 = plVar20 + 1;
  } while (plVar5 < plVar22);
  while( true ) {
    *(short *)plVar22 = (short)plVar19 - (short)pcVar14;
    if (pBVar25 == pBVar24) {
      plVar20 = (long *)(pBVar24 + (uVar7 - (long)(pcVar14 + (long)pBVar18)) + (long)plVar19);
      if (plVar8 < pBVar24 + (uVar7 - (long)(pcVar14 + (long)pBVar18)) + (long)plVar19) {
        plVar20 = plVar8;
      }
      uVar3 = LZ4_count((BYTE *)((long)plVar19 + 4),(BYTE *)(pcVar14 + (long)(pBVar18 + 4)),
                        (BYTE *)plVar20);
      plVar19 = (long *)((long)plVar19 + (ulong)(uVar3 + 4));
      if (plVar19 == plVar20) {
        uVar2 = LZ4_count((BYTE *)plVar20,(BYTE *)source,(BYTE *)plVar8);
        uVar3 = uVar3 + uVar2;
        plVar19 = (long *)((ulong)uVar2 + (long)plVar20);
      }
    }
    else {
      uVar3 = LZ4_count((BYTE *)((long)plVar19 + 4),(BYTE *)(pcVar14 + 4),(BYTE *)plVar8);
      plVar19 = (long *)((long)plVar19 + (ulong)(uVar3 + 4));
    }
    if (dest + maxOutputSize < (char *)((long)plVar22 + (ulong)(uVar3 >> 8) + 8)) {
      iVar15 = 0;
      goto LAB_00169137;
    }
    pcVar13 = (char *)((long)plVar22 + 2);
    if (uVar3 < 0xf) {
      *local_a0 = *local_a0 + (char)uVar3;
    }
    else {
      *local_a0 = *local_a0 + '\x0f';
      for (uVar3 = uVar3 - 0xf; 0x1fd < uVar3; uVar3 = uVar3 - 0x1fe) {
        pcVar13[0] = -1;
        pcVar13[1] = -1;
        pcVar13 = pcVar13 + 2;
      }
      if (0xfe < uVar3) {
        uVar3 = uVar3 - 0xff;
        *pcVar13 = -1;
        pcVar13 = pcVar13 + 1;
      }
      *pcVar13 = (char)uVar3;
      pcVar13 = pcVar13 + 1;
    }
    if (pBVar29 + -0xc < plVar19) goto LAB_00168d2c;
    *(int *)((long)LZ4_stream->table +
            (ulong)((uint)((ulong)(*(long *)((long)plVar19 + -2) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) *
            4) = ((int)plVar19 + -2) - iVar11;
    uVar6 = (ulong)((uint)((ulong)(*plVar19 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
    uVar23 = (ulong)*(uint *)((long)LZ4_stream->table + uVar6 * 4);
    pcVar14 = (char *)(uVar23 + lVar27);
    pBVar25 = (BYTE *)source;
    pBVar18 = (BYTE *)0x0;
    if (pcVar14 < source) {
      pBVar25 = pBVar24;
      pBVar18 = pBVar24 + (uVar7 - (long)source);
    }
    *(int *)((long)LZ4_stream->table + uVar6 * 4) = (int)plVar19 - iVar11;
    plVar20 = plVar19;
    local_a0 = pcVar13;
    if (((long *)(uVar23 + lVar27 + 0xffff) < plVar19) ||
       (*(int *)(pcVar14 + (long)pBVar18) != (int)*plVar19)) break;
    plVar22 = (long *)(pcVar13 + 1);
    *pcVar13 = '\0';
  }
  goto LAB_001689e5;
LAB_0016863f:
  pBVar25 = (BYTE *)source;
  if (pcVar13 < source) {
    pBVar25 = pBVar24;
  }
  cVar17 = (char)plVar5 * '\x10' + (char)plVar20 * -0x10;
  for (lVar26 = 0;
      ((plVar19 = (long *)((long)plVar5 + lVar26), plVar20 < plVar19 &&
       (pBVar25 < source + (long)(pBVar18 + lVar26 + (uVar6 - uVar9)))) &&
      (*(char *)((long)plVar5 + lVar26 + -1) ==
       source[(long)(pBVar18 + lVar26 + (uVar6 - uVar9) + -1)])); lVar26 = lVar26 + -1) {
    cVar17 = cVar17 + -0x10;
  }
  uVar3 = iVar15 - (int)plVar20;
  uVar30 = (ulong)(uVar3 + (int)lVar26);
  uVar23 = (ulong)uVar3 + lVar26;
  if (dest + maxOutputSize < local_a0 + (uVar23 & 0xffffffff) / 0xff + uVar30 + 9)
  goto LAB_00168903;
  if ((uint)uVar23 < 0xf) {
    plVar5 = (long *)(local_a0 + 1);
    *local_a0 = cVar17;
  }
  else {
    *local_a0 = -0x10;
    plVar5 = (long *)(local_a0 + 2);
    for (iVar15 = (iVar15 - (int)plVar20) + (int)lVar26 + -0xf; 0xfe < iVar15;
        iVar15 = iVar15 + -0xff) {
      *(char *)((long)plVar5 + -1) = -1;
      plVar5 = (long *)((long)plVar5 + 1);
    }
    *(char *)((long)plVar5 + -1) = (char)iVar15;
  }
  pcVar13 = source + lVar26 + (uVar6 - uVar9);
  plVar22 = (long *)(uVar30 + (long)plVar5);
  do {
    *plVar5 = *plVar20;
    plVar5 = plVar5 + 1;
    plVar20 = plVar20 + 1;
  } while (plVar5 < plVar22);
  while( true ) {
    *(short *)plVar22 = (short)plVar19 - (short)pcVar13;
    if (pBVar25 == pBVar24) {
      plVar20 = (long *)(pBVar24 + (uVar7 - (long)(pcVar13 + (long)pBVar18)) + (long)plVar19);
      if (plVar8 < pBVar24 + (uVar7 - (long)(pcVar13 + (long)pBVar18)) + (long)plVar19) {
        plVar20 = plVar8;
      }
      uVar3 = LZ4_count((BYTE *)((long)plVar19 + 4),(BYTE *)(pcVar13 + (long)(pBVar18 + 4)),
                        (BYTE *)plVar20);
      plVar19 = (long *)((long)plVar19 + (ulong)(uVar3 + 4));
      if (plVar19 == plVar20) {
        uVar2 = LZ4_count((BYTE *)plVar20,(BYTE *)source,(BYTE *)plVar8);
        uVar3 = uVar3 + uVar2;
        plVar19 = (long *)((ulong)uVar2 + (long)plVar20);
      }
    }
    else {
      uVar3 = LZ4_count((BYTE *)((long)plVar19 + 4),(BYTE *)(pcVar13 + 4),(BYTE *)plVar8);
      plVar19 = (long *)((long)plVar19 + (ulong)(uVar3 + 4));
    }
    if (dest + maxOutputSize < (char *)((long)plVar22 + (ulong)(uVar3 >> 8) + 8)) goto LAB_00168903;
    pcVar13 = (char *)((long)plVar22 + 2);
    if (uVar3 < 0xf) {
      *local_a0 = *local_a0 + (char)uVar3;
      local_a0 = pcVar13;
    }
    else {
      *local_a0 = *local_a0 + '\x0f';
      for (uVar3 = uVar3 - 0xf; 0x1fd < uVar3; uVar3 = uVar3 - 0x1fe) {
        pcVar13[0] = -1;
        pcVar13[1] = -1;
        pcVar13 = pcVar13 + 2;
      }
      if (0xfe < uVar3) {
        uVar3 = uVar3 - 0xff;
        *pcVar13 = -1;
        pcVar13 = pcVar13 + 1;
      }
      *pcVar13 = (char)uVar3;
      local_a0 = pcVar13 + 1;
    }
    if (pBVar29 + -0xc < plVar19) goto LAB_001690c2;
    *(int *)((long)LZ4_stream->table +
            (ulong)((uint)((ulong)(*(long *)((long)plVar19 + -2) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) *
            4) = ((int)plVar19 + -2) - iVar11;
    uVar6 = (ulong)((uint)((ulong)(*plVar19 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
    uVar23 = (ulong)*(uint *)((long)LZ4_stream->table + uVar6 * 4);
    pcVar13 = (char *)(lVar27 + uVar23);
    pBVar25 = (BYTE *)source;
    pBVar18 = (BYTE *)0x0;
    if (pcVar13 < source) {
      pBVar25 = pBVar24;
      pBVar18 = pBVar24 + (uVar7 - (long)source);
    }
    *(int *)((long)LZ4_stream->table + uVar6 * 4) = (int)plVar19 - iVar11;
    plVar20 = plVar19;
    if (((pcVar13 < source + -uVar7) || ((long *)(lVar27 + uVar23 + 0xffff) < plVar19)) ||
       (*(int *)(pcVar13 + (long)pBVar18) != (int)*plVar19)) break;
    plVar22 = (long *)(local_a0 + 1);
    *local_a0 = '\0';
  }
  goto LAB_001685bb;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* streamPtr = (LZ4_stream_t_internal*)LZ4_stream;
    const BYTE* const dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    const BYTE* smallest = (const BYTE*) source;
    if (streamPtr->initCheck) return 0;   /* Uninitialized structure detected */
    if ((streamPtr->dictSize>0) && (smallest>dictEnd)) smallest = dictEnd;
    LZ4_renormDictT(streamPtr, smallest);
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;

    /* Check overlapping input/dictionary space */
    {
        const BYTE* sourceEnd = (const BYTE*) source + inputSize;
        if ((sourceEnd > streamPtr->dictionary) && (sourceEnd < dictEnd))
        {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == (const BYTE*)source)
    {
        int result;
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            result = LZ4_compress_generic(LZ4_stream, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, withPrefix64k, dictSmall, acceleration);
        else
            result = LZ4_compress_generic(LZ4_stream, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, withPrefix64k, noDictIssue, acceleration);
        streamPtr->dictSize += (U32)inputSize;
        streamPtr->currentOffset += (U32)inputSize;
        return result;
    }

    /* external dictionary mode */
    {
        int result;
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            result = LZ4_compress_generic(LZ4_stream, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, usingExtDict, dictSmall, acceleration);
        else
            result = LZ4_compress_generic(LZ4_stream, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, usingExtDict, noDictIssue, acceleration);
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        streamPtr->currentOffset += (U32)inputSize;
        return result;
    }
}